

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleShaderBuiltInTests.cpp
# Opt level: O2

TestCaseGroup * vkt::pipeline::createMultisampleShaderBuiltInTests(TestContext *testCtx)

{
  TestCaseGroup *pTVar1;
  TestNode *pTVar2;
  TestNode *pTVar3;
  allocator<char> local_179;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> sampleMaskGroup;
  VkSampleCountFlagBits samplesSetReduced [5];
  undefined1 local_148 [16];
  undefined8 local_138;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> samplePositionGroup;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> testGroup;
  VkSampleCountFlagBits samplesSetFull [6];
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,testCtx,"multisample_shader_builtin",
             "Multisample Shader BuiltIn Tests");
  local_148._0_4_ = 0x80;
  local_148._4_4_ = 0x80;
  local_148._8_8_ = 0x8900000001;
  local_138 = 0x1000000bf;
  samplesSetFull[0] = VK_SAMPLE_COUNT_2_BIT;
  samplesSetFull[1] = VK_SAMPLE_COUNT_4_BIT;
  samplesSetFull[2] = VK_SAMPLE_COUNT_8_BIT;
  samplesSetFull[3] = VK_SAMPLE_COUNT_16_BIT;
  samplesSetFull[4] = VK_SAMPLE_COUNT_32_BIT;
  samplesSetFull[5] = VK_SAMPLE_COUNT_64_BIT;
  testGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr
       = (TestCaseGroup *)pTVar2;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"sample_id",(allocator<char> *)samplesSetReduced);
  pTVar3 = &makeMSGroup<vkt::pipeline::multisample::MSCase<vkt::pipeline::multisample::MSCaseSampleID>>
                      (testCtx,&local_30,(UVec3 *)local_148,2,samplesSetFull,6)->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  std::__cxx11::string::~string((string *)&local_30);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,testCtx,"sample_position","Sample Position Tests");
  samplePositionGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = (TestCaseGroup *)pTVar2;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"distribution",(allocator<char> *)samplesSetReduced);
  pTVar3 = &makeMSGroup<vkt::pipeline::multisample::MSCase<vkt::pipeline::multisample::MSCaseSamplePosDistribution>>
                      (testCtx,&local_50,(UVec3 *)local_148,2,samplesSetFull,6)->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  std::__cxx11::string::~string((string *)&local_50);
  pTVar1 = samplePositionGroup.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"correctness",(allocator<char> *)samplesSetReduced);
  pTVar2 = &makeMSGroup<vkt::pipeline::multisample::MSCase<vkt::pipeline::multisample::MSCaseSamplePosCorrectness>>
                      (testCtx,&local_70,(UVec3 *)local_148,2,samplesSetFull,6)->super_TestNode;
  tcu::TestNode::addChild(&pTVar1->super_TestNode,pTVar2);
  std::__cxx11::string::~string((string *)&local_70);
  pTVar1 = samplePositionGroup.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  samplePositionGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = (TestCaseGroup *)0x0;
  tcu::TestNode::addChild
            (&(testGroup.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              ptr)->super_TestNode,&pTVar1->super_TestNode);
  samplesSetReduced[0] = VK_SAMPLE_COUNT_2_BIT;
  samplesSetReduced[1] = VK_SAMPLE_COUNT_4_BIT;
  samplesSetReduced[2] = VK_SAMPLE_COUNT_8_BIT;
  samplesSetReduced[3] = VK_SAMPLE_COUNT_16_BIT;
  samplesSetReduced[4] = VK_SAMPLE_COUNT_32_BIT;
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,testCtx,"sample_mask","Sample Mask Tests");
  sampleMaskGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = (TestCaseGroup *)pTVar2;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"pattern",&local_179);
  pTVar3 = &makeMSGroup<vkt::pipeline::multisample::MSCase<vkt::pipeline::multisample::MSCaseSampleMaskPattern>>
                      (testCtx,&local_90,(UVec3 *)local_148,2,samplesSetReduced,5)->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  std::__cxx11::string::~string((string *)&local_90);
  pTVar1 = sampleMaskGroup.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"bit_count",&local_179);
  pTVar2 = &makeMSGroup<vkt::pipeline::multisample::MSCase<vkt::pipeline::multisample::MSCaseSampleMaskBitCount>>
                      (testCtx,&local_b0,(UVec3 *)local_148,2,samplesSetReduced,5)->super_TestNode;
  tcu::TestNode::addChild(&pTVar1->super_TestNode,pTVar2);
  std::__cxx11::string::~string((string *)&local_b0);
  pTVar1 = sampleMaskGroup.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"correct_bit",&local_179);
  pTVar2 = &makeMSGroup<vkt::pipeline::multisample::MSCase<vkt::pipeline::multisample::MSCaseSampleMaskCorrectBit>>
                      (testCtx,&local_d0,(UVec3 *)local_148,2,samplesSetReduced,5)->super_TestNode;
  tcu::TestNode::addChild(&pTVar1->super_TestNode,pTVar2);
  std::__cxx11::string::~string((string *)&local_d0);
  pTVar1 = sampleMaskGroup.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"write",&local_179);
  pTVar2 = &makeMSGroup<vkt::pipeline::multisample::MSCase<vkt::pipeline::multisample::MSCaseSampleMaskWrite>>
                      (testCtx,&local_f0,(UVec3 *)local_148,2,samplesSetReduced,5)->super_TestNode;
  tcu::TestNode::addChild(&pTVar1->super_TestNode,pTVar2);
  std::__cxx11::string::~string((string *)&local_f0);
  pTVar1 = sampleMaskGroup.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  sampleMaskGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = (TestCaseGroup *)0x0;
  tcu::TestNode::addChild
            (&(testGroup.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              ptr)->super_TestNode,&pTVar1->super_TestNode);
  pTVar1 = testGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
           m_data.ptr;
  testGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr
       = (TestCaseGroup *)0x0;
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&sampleMaskGroup.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&samplePositionGroup.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&testGroup.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  return pTVar1;
}

Assistant:

tcu::TestCaseGroup* createMultisampleShaderBuiltInTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> testGroup(new tcu::TestCaseGroup(testCtx, "multisample_shader_builtin", "Multisample Shader BuiltIn Tests"));

	const tcu::UVec3 imageSizes[] =
	{
		tcu::UVec3(128u, 128u, 1u),
		tcu::UVec3(137u, 191u, 1u),
	};

	const deUint32 sizesElemCount = static_cast<deUint32>(sizeof(imageSizes) / sizeof(tcu::UVec3));

	const vk::VkSampleCountFlagBits samplesSetFull[] =
	{
		vk::VK_SAMPLE_COUNT_2_BIT,
		vk::VK_SAMPLE_COUNT_4_BIT,
		vk::VK_SAMPLE_COUNT_8_BIT,
		vk::VK_SAMPLE_COUNT_16_BIT,
		vk::VK_SAMPLE_COUNT_32_BIT,
		vk::VK_SAMPLE_COUNT_64_BIT,
	};

	const deUint32 samplesSetFullCount = static_cast<deUint32>(sizeof(samplesSetFull) / sizeof(vk::VkSampleCountFlagBits));

	testGroup->addChild(makeMSGroup<multisample::MSCase<multisample::MSCaseSampleID> >(testCtx, "sample_id", imageSizes, sizesElemCount, samplesSetFull, samplesSetFullCount));

	de::MovePtr<tcu::TestCaseGroup> samplePositionGroup(new tcu::TestCaseGroup(testCtx, "sample_position", "Sample Position Tests"));

	samplePositionGroup->addChild(makeMSGroup<multisample::MSCase<multisample::MSCaseSamplePosDistribution> >(testCtx, "distribution", imageSizes, sizesElemCount, samplesSetFull, samplesSetFullCount));
	samplePositionGroup->addChild(makeMSGroup<multisample::MSCase<multisample::MSCaseSamplePosCorrectness> > (testCtx, "correctness",  imageSizes, sizesElemCount, samplesSetFull, samplesSetFullCount));

	testGroup->addChild(samplePositionGroup.release());

	const vk::VkSampleCountFlagBits samplesSetReduced[] =
	{
		vk::VK_SAMPLE_COUNT_2_BIT,
		vk::VK_SAMPLE_COUNT_4_BIT,
		vk::VK_SAMPLE_COUNT_8_BIT,
		vk::VK_SAMPLE_COUNT_16_BIT,
		vk::VK_SAMPLE_COUNT_32_BIT,
	};

	const deUint32 samplesSetReducedCount = static_cast<deUint32>(sizeof(samplesSetReduced) / sizeof(vk::VkSampleCountFlagBits));

	de::MovePtr<tcu::TestCaseGroup> sampleMaskGroup(new tcu::TestCaseGroup(testCtx, "sample_mask", "Sample Mask Tests"));

	sampleMaskGroup->addChild(makeMSGroup<multisample::MSCase<multisample::MSCaseSampleMaskPattern> >	(testCtx, "pattern",	imageSizes, sizesElemCount, samplesSetReduced, samplesSetReducedCount));
	sampleMaskGroup->addChild(makeMSGroup<multisample::MSCase<multisample::MSCaseSampleMaskBitCount> >	(testCtx, "bit_count",	imageSizes, sizesElemCount, samplesSetReduced, samplesSetReducedCount));
	sampleMaskGroup->addChild(makeMSGroup<multisample::MSCase<multisample::MSCaseSampleMaskCorrectBit> >(testCtx, "correct_bit",imageSizes, sizesElemCount, samplesSetReduced, samplesSetReducedCount));
	sampleMaskGroup->addChild(makeMSGroup<multisample::MSCase<multisample::MSCaseSampleMaskWrite> >		(testCtx, "write",		imageSizes, sizesElemCount, samplesSetReduced, samplesSetReducedCount));

	testGroup->addChild(sampleMaskGroup.release());

	return testGroup.release();
}